

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

bool __thiscall
helics::CoreBroker::checkInterfaceCreation
          (CoreBroker *this,ActionMessage *message,InterfaceType type)

{
  HandleManager *this_00;
  _Alloc_hider _Var1;
  BasicHandleInfo *pBVar2;
  iterator iVar3;
  InterfaceType type_00;
  byte *pbVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer pBVar6;
  string_view sVar7;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  ActionMessage eret;
  string local_140;
  ActionMessage local_120;
  char *local_68;
  size_t local_60;
  byte *local_58;
  size_t sStack_50;
  byte *local_48;
  size_t local_40;
  size_t sVar5;
  
  this_00 = &this->handles;
  sVar5 = (message->payload).bufferSize;
  pbVar4 = (message->payload).heap;
  type_00 = type;
  if (type == TRANSLATOR) {
    name._M_str = (char *)pbVar4;
    name._M_len = sVar5;
    pBVar2 = HandleManager::getInterfaceHandle(this_00,name,ENDPOINT);
    if ((pBVar2 == (BasicHandleInfo *)0x0) &&
       (name_00._M_str = (char *)(message->payload).heap,
       name_00._M_len = (message->payload).bufferSize,
       pBVar2 = HandleManager::getInterfaceHandle(this_00,name_00,INPUT),
       pBVar2 == (BasicHandleInfo *)0x0)) {
      sVar5 = (message->payload).bufferSize;
      pbVar4 = (message->payload).heap;
      type_00 = PUBLICATION;
      goto LAB_00347ea4;
    }
  }
  else {
LAB_00347ea4:
    name_01._M_str = (char *)pbVar4;
    name_01._M_len = sVar5;
    pBVar2 = HandleManager::getInterfaceHandle(this_00,name_01,type_00);
    if (pBVar2 == (BasicHandleInfo *)0x0) {
      if (type == INPUT) {
        return true;
      }
      if ((this->super_BrokerBase).disableDynamicSources == false) {
        return true;
      }
      if ((this->super_BrokerBase).brokerState._M_i != OPERATING) {
        return true;
      }
      iVar3 = std::
              _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&(this->mFederates).lookup2,&message->source_id);
      if ((iVar3.
           super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
           ._M_cur == (__node_type *)0x0) ||
         (pBVar6 = (this->mFederates).dataStorage.
                   super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   *(long *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
                                   ._M_cur + 0x10),
         pBVar6 == (this->mFederates).dataStorage.
                   super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish)) {
        ActionMessage::ActionMessage
                  (&local_120,cmd_local_error,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(message->source_id).gid);
        local_120.dest_handle.hid = (message->source_handle).hid;
        local_120.messageID = -1;
        sVar7 = interfaceTypeName(type);
        local_68 = sVar7._M_str;
        local_60 = sVar7._M_len;
        sStack_50 = (message->payload).bufferSize;
        local_58 = (message->payload).heap;
        fmt_01.size_ = 0xdd;
        fmt_01.data_ = (char *)0x3b;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_68;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_140,(v11 *)"Source {} not allowed after entering initializing mode ({})",
                   fmt_01,args_01);
        _Var1._M_p = local_140._M_dataplus._M_p;
        if ((byte *)local_140._M_dataplus._M_p == local_120.payload.heap) {
          local_120.payload.bufferSize = local_140._M_string_length;
        }
        else {
          SmallBuffer::reserve(&local_120.payload,local_140._M_string_length);
          local_120.payload.bufferSize = local_140._M_string_length;
          if (local_140._M_string_length != 0) {
            memcpy(local_120.payload.heap,_Var1._M_p,local_140._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        propagateError(this,&local_120);
      }
      else {
        if (((pBVar6->observer == false) && (pBVar6->dynamic == true)) &&
           (pBVar6->state == CONNECTED)) {
          return true;
        }
        ActionMessage::ActionMessage
                  (&local_120,cmd_local_error,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(message->source_id).gid);
        local_120.dest_handle.hid = (message->source_handle).hid;
        local_120.messageID = -1;
        sVar7 = interfaceTypeName(type);
        local_68 = sVar7._M_str;
        local_60 = sVar7._M_len;
        local_40 = (message->payload).bufferSize;
        local_48 = (message->payload).heap;
        local_58 = (byte *)(pBVar6->name)._M_dataplus._M_p;
        sStack_50 = (pBVar6->name)._M_string_length;
        fmt_00.size_ = 0xddd;
        fmt_00.data_ = (char *)0x43;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_68;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_140,
                   (v11 *)"Source {} from {} not allowed after entering initializing mode ({})",
                   fmt_00,args_00);
        _Var1._M_p = local_140._M_dataplus._M_p;
        if ((byte *)local_140._M_dataplus._M_p == local_120.payload.heap) {
          local_120.payload.bufferSize = local_140._M_string_length;
        }
        else {
          SmallBuffer::reserve(&local_120.payload,local_140._M_string_length);
          local_120.payload.bufferSize = local_140._M_string_length;
          if (local_140._M_string_length != 0) {
            memcpy(local_120.payload.heap,_Var1._M_p,local_140._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        propagateError(this,&local_120);
      }
      goto LAB_00347f95;
    }
  }
  ActionMessage::ActionMessage
            (&local_120,cmd_local_error,
             (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
             (GlobalFederateId)(message->source_id).gid);
  local_120.dest_handle.hid = (message->source_handle).hid;
  local_120.messageID = -1;
  sVar7 = interfaceTypeName(type);
  local_68 = sVar7._M_str;
  local_60 = sVar7._M_len;
  sStack_50 = (message->payload).bufferSize;
  local_58 = (message->payload).heap;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x17;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_68;
  ::fmt::v11::vformat_abi_cxx11_(&local_140,(v11 *)"Duplicate {} names ({})",fmt,args);
  _Var1._M_p = local_140._M_dataplus._M_p;
  if ((byte *)local_140._M_dataplus._M_p == local_120.payload.heap) {
    local_120.payload.bufferSize = local_140._M_string_length;
  }
  else {
    SmallBuffer::reserve(&local_120.payload,local_140._M_string_length);
    local_120.payload.bufferSize = local_140._M_string_length;
    if (local_140._M_string_length != 0) {
      memcpy(local_120.payload.heap,_Var1._M_p,local_140._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  propagateError(this,&local_120);
LAB_00347f95:
  ActionMessage::~ActionMessage(&local_120);
  return false;
}

Assistant:

bool CoreBroker::checkInterfaceCreation(ActionMessage& message, InterfaceType type)
{
    bool existingName{false};
    if (type == InterfaceType::TRANSLATOR) {
        existingName =
            (handles.getInterfaceHandle(message.name(), InterfaceType::ENDPOINT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::INPUT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::PUBLICATION) != nullptr);
    } else {
        existingName = (handles.getInterfaceHandle(message.name(), type) != nullptr);
    }

    // detect duplicate InterfaceName;
    if (existingName) {
        ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
        eret.dest_handle = message.source_handle;
        eret.messageID = defs::Errors::REGISTRATION_FAILURE;
        eret.payload =
            fmt::format("Duplicate {} names ({})", interfaceTypeName(type), message.name());
        propagateError(std::move(eret));
        return false;
    }
    if (disableDynamicSources && type != InterfaceType::INPUT) {
        if (getBrokerState() == BrokerState::OPERATING) {
            auto fed = mFederates.find(message.source_id);
            if (fed == mFederates.end()) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload =
                    fmt::format("Source {} not allowed after entering initializing mode ({})",
                                interfaceTypeName(type),
                                message.name());
                propagateError(std::move(eret));
                return false;
            }
            if (fed->observer || !fed->dynamic || fed->state != ConnectionState::CONNECTED) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload = fmt::format(
                    "Source {} from {} not allowed after entering initializing mode ({})",
                    interfaceTypeName(type),
                    fed->name,
                    message.name());
                propagateError(std::move(eret));
                return false;
            }
        }
    }
    return true;
}